

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpReqInfo.hpp
# Opt level: O0

bool __thiscall
Husky::HttpReqInfo::_parseUrl
          (HttpReqInfo *this,string *url,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mp)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  ulong in_RSI;
  bool bVar4;
  uint i;
  uint vright;
  uint vleft;
  uint kright;
  uint kleft;
  uint pos;
  mapped_type *in_stack_ffffffffffffff38;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string local_78 [32];
  string local_58 [32];
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  ulong local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_24 = std::__cxx11::string::find((char)local_18,0x3f);
    if ((ulong)local_24 == 0xffffffffffffffff) {
      local_1 = false;
    }
    else {
      local_28 = 0;
      local_2c = 0;
      local_30 = 0;
      local_34 = 0;
      local_38 = local_24;
      while( true ) {
        local_38 = local_38 + 1;
        uVar1 = (ulong)local_38;
        uVar2 = std::__cxx11::string::size();
        if (uVar2 <= uVar1) break;
        local_28 = local_38;
        while( true ) {
          uVar1 = (ulong)local_38;
          uVar2 = std::__cxx11::string::size();
          bVar4 = false;
          if (uVar1 < uVar2) {
            pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
            bVar4 = *pcVar3 != '=';
          }
          if (!bVar4) break;
          local_38 = local_38 + 1;
        }
        uVar1 = (ulong)local_38;
        uVar2 = std::__cxx11::string::size();
        if (uVar2 <= uVar1) break;
        local_2c = local_38;
        local_38 = local_38 + 1;
        local_30 = local_38;
        while( true ) {
          uVar1 = (ulong)local_38;
          uVar2 = std::__cxx11::string::size();
          bVar4 = false;
          if (uVar1 < uVar2) {
            pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
            bVar4 = false;
            if (*pcVar3 != '&') {
              pcVar3 = (char *)std::__cxx11::string::operator[](local_18);
              bVar4 = *pcVar3 != ' ';
            }
          }
          if (!bVar4) break;
          local_38 = local_38 + 1;
        }
        local_34 = local_38;
        std::__cxx11::string::substr((ulong)local_58,local_18);
        this_00 = local_20;
        std::__cxx11::string::substr((ulong)local_78,local_18);
        in_stack_ffffffffffffff38 =
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,in_stack_ffffffffffffff38);
        std::__cxx11::string::operator=((string *)in_stack_ffffffffffffff38,local_58);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_58);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool _parseUrl(const string& url, HashMap<string, string>& mp)
            {
                if(url.empty())
                {
                    return false;
                }

                uint pos = url.find('?');
                if(string::npos == pos)
                {
                    return false;
                }
                uint kleft = 0, kright = 0;
                uint vleft = 0, vright = 0;
                for(uint i = pos + 1; i < url.size();)
                {
                    kleft = i;
                    while(i < url.size() && url[i] != '=')
                    {
                        i++;
                    }
                    if(i >= url.size())
                    {
                        break;
                    }
                    kright = i;
                    i++;
                    vleft = i;
                    while(i < url.size() && url[i] != '&' && url[i] != ' ')
                    {
                        i++;
                    }
                    vright = i;
                    mp[url.substr(kleft, kright - kleft)] = url.substr(vleft, vright - vleft);
                    i++;
                }

                return true;
            }